

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_enable_x11_forwarding
                (Channel *chan,_Bool oneshot,ptrlen authproto,ptrlen authdata_hex,uint screen_number
                )

{
  uint uVar1;
  strbuf *sb;
  ushort **ppuVar2;
  ulong uVar3;
  char *screen_number_suffix;
  ptrlen authdata;
  char *screensuffix;
  void *pvStack_68;
  char hexbuf [3];
  uchar *hex;
  size_t i;
  strbuf *authdata_bin;
  sesschan *sess;
  _Bool oneshot_local;
  Channel *chan_local;
  ptrlen authdata_hex_local;
  ptrlen authproto_local;
  
  if (oneshot) {
    authproto_local.len._7_1_ = false;
  }
  else if (((undefined1  [16])authdata_hex & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    sb = strbuf_new_nm();
    for (hex = (uchar *)0x0; hex < (uchar *)authdata_hex.len; hex = hex + 2) {
      pvStack_68 = authdata_hex.ptr;
      ppuVar2 = __ctype_b_loc();
      if ((((*ppuVar2)[(int)(uint)*(byte *)((long)pvStack_68 + (long)hex)] & 0x1000) == 0) ||
         (ppuVar2 = __ctype_b_loc(),
         ((*ppuVar2)[(int)(uint)hex[(long)pvStack_68 + 1]] & 0x1000) == 0)) {
        strbuf_free(sb);
        return false;
      }
      screensuffix._5_1_ = *(uchar *)((long)pvStack_68 + (long)hex);
      screensuffix._6_1_ = hex[(long)pvStack_68 + 1];
      screensuffix._7_1_ = 0;
      uVar3 = strtoul((char *)((long)&screensuffix + 5),(char **)0x0,0x10);
      BinarySink_put_byte(sb->binarysink_,(uchar)uVar3);
    }
    chan[-7].vt = (ChannelVtable *)&xfwd_plugvt;
    screen_number_suffix = dupprintf(".%u",(ulong)screen_number);
    authdata = ptrlen_from_strbuf(sb);
    uVar1 = platform_make_x11_server
                      ((Plug *)(chan + -7),"Uppity",10,screen_number_suffix,authproto,authdata,
                       (Socket **)(chan + -6),(Conf *)chan[-0x5c].vt);
    chan[-7].initial_fixed_window_size = uVar1;
    safefree(screen_number_suffix);
    strbuf_free(sb);
    authproto_local.len._7_1_ = chan[-7].initial_fixed_window_size != 0;
  }
  else {
    authproto_local.len._7_1_ = false;
  }
  return authproto_local.len._7_1_;
}

Assistant:

bool sesschan_enable_x11_forwarding(
    Channel *chan, bool oneshot, ptrlen authproto, ptrlen authdata_hex,
    unsigned screen_number)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    strbuf *authdata_bin;
    size_t i;

    if (oneshot)
        return false;                  /* not supported */

    /*
     * Decode the authorisation data from ASCII hex into binary.
     */
    if (authdata_hex.len % 2)
        return false;                  /* expected an even number of digits */
    authdata_bin = strbuf_new_nm();
    for (i = 0; i < authdata_hex.len; i += 2) {
        const unsigned char *hex = authdata_hex.ptr;
        char hexbuf[3];

        if (!isxdigit(hex[i]) || !isxdigit(hex[i+1])) {
            strbuf_free(authdata_bin);
            return false;              /* not hex */
        }

        hexbuf[0] = hex[i];
        hexbuf[1] = hex[i+1];
        hexbuf[2] = '\0';
        put_byte(authdata_bin, strtoul(hexbuf, NULL, 16));
    }

    sess->xfwd_plug.vt = &xfwd_plugvt;

    char *screensuffix = dupprintf(".%u", screen_number);

    sess->n_x11_sockets = platform_make_x11_server(
        &sess->xfwd_plug, appname, 10, screensuffix,
        authproto, ptrlen_from_strbuf(authdata_bin),
        sess->x11_sockets, sess->conf);

    sfree(screensuffix);
    strbuf_free(authdata_bin);
    return sess->n_x11_sockets != 0;
}